

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O0

Filter * __thiscall
helics::ConnectorFederateManager::getFilter(ConnectorFederateManager *this,int index)

{
  bool bVar1;
  shared_handle sharedFilt;
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff98;
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  *in_stack_ffffffffffffffa0;
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffffd8;
  type local_8;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock_shared(in_stack_ffffffffffffffd8);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator*((shared_lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
               *)&stack0xffffffffffffffd0);
  bVar1 = isValidIndex<int,gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>>
                    ((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_ffffffffffffff98);
  if (bVar1) {
    gmlc::libguarded::
    shared_lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
    ::operator*((shared_lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
                 *)&stack0xffffffffffffffd0);
    gmlc::containers::
    StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
    ::operator[](in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    local_8 = std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::operator*
                        ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
                         in_stack_ffffffffffffffa0);
  }
  else {
    local_8 = (type)invalidFilt;
  }
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
              *)0x3e00ae);
  return local_8;
}

Assistant:

const Filter& ConnectorFederateManager::getFilter(int index) const
{
    auto sharedFilt = filters.lock_shared();
    if (isValidIndex(index, *sharedFilt)) {
        return *(*sharedFilt)[index];
    }
    return invalidFilt;
}